

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block.c
# Opt level: O0

void av1_cdef_filter_fb(uint8_t *dst8,uint16_t *dst16,int dstride,uint16_t *in,int xdec,int ydec,
                       int (*dir) [16],int *dirinit,int (*var) [16],int pli,cdef_list *dlist,
                       int cdef_count,int level,int sec_strength,int damping,int coeff_shift)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  byte bVar7;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  int *in_stack_00000010;
  int in_stack_00000020;
  long in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  int in_stack_00000048;
  int in_stack_00000050;
  int strength_index_1;
  int t_1;
  cdef_filter_block_func cdef_filter_fn_1 [4];
  int block_height_1;
  int block_width_1;
  int strength_index;
  int t;
  cdef_filter_block_func cdef_filter_fn [4];
  int block_height;
  int block_width;
  int iy;
  int bh_log2;
  int bw_log2;
  int pri_strength;
  int by;
  int bx;
  int bi;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  int local_144;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined8 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  int iVar8;
  uint16_t *in_stack_fffffffffffffee0;
  int local_114;
  int local_100;
  int local_fc;
  int local_c4;
  _func_void_void_ptr_int_uint16_t_ptr_int_int_int_int_int_int_int_int *local_b8 [4];
  int local_98;
  int local_94;
  uint local_90;
  int local_8c;
  _func_void_void_ptr_int_uint16_t_ptr_int_int_int_int_int_int_int_int *local_88 [4];
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  uint local_4c;
  uint local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  int local_2c;
  long local_28;
  long local_20;
  
  local_50 = in_stack_00000038 << ((byte)in_stack_00000050 & 0x1f);
  iVar2 = in_stack_00000040 << ((byte)in_stack_00000050 & 0x1f);
  iVar3 = (in_stack_00000050 - (uint)(in_stack_00000020 != 0)) + in_stack_00000048;
  local_54 = 3 - in_R8D;
  local_58 = 3 - in_R9D;
  local_38 = in_RCX;
  local_28 = in_RSI;
  if (((in_stack_00000010 == (int *)0x0) || (local_50 != 0)) || (iVar2 != 0)) {
    local_40 = in_R9D;
    local_3c = in_R8D;
    local_2c = in_EDX;
    local_20 = in_RDI;
    if (((in_stack_00000020 == 0) &&
        ((in_stack_00000010 == (int *)0x0 || (*in_stack_00000010 == 0)))) &&
       (aom_cdef_find_dir(in_stack_fffffffffffffee0,
                          (cdef_list *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                          ,(int (*) [16])
                           CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                          (int)in_stack_fffffffffffffec8,
                          (int (*) [16])
                          CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)),
       in_stack_00000010 != (int *)0x0)) {
      *in_stack_00000010 = 1;
    }
    if ((in_stack_00000020 == 1) && (local_3c != local_40)) {
      for (local_44 = 0; local_44 < in_stack_00000030; local_44 = local_44 + 1) {
        uVar4 = (uint)*(byte *)(in_stack_00000028 + (long)local_44 * 2);
        uVar5 = (uint)*(byte *)(in_stack_00000028 + 1 + (long)local_44 * 2);
        piVar6 = av1_cdef_filter_fb::conv440;
        if (local_3c != 0) {
          piVar6 = av1_cdef_filter_fb::conv422;
        }
        *(int *)(in_stack_00000008 + (long)(int)uVar4 * 0x40 + (long)(int)uVar5 * 4) =
             piVar6[*(int *)(in_stack_00000008 + (long)(int)uVar4 * 0x40 + (long)(int)uVar5 * 4)];
      }
    }
    if (local_20 == 0) {
      local_94 = 8 >> ((byte)local_3c & 0x1f);
      local_98 = 8 >> ((byte)local_40 & 0x1f);
      local_b8[0] = cdef_filter_16_0;
      local_b8[1] = cdef_filter_16_1;
      local_b8[2] = cdef_filter_16_2;
      local_b8[3] = cdef_filter_16_3;
      for (local_44 = 0; local_44 < in_stack_00000030; local_44 = local_44 + 1) {
        local_4c = (uint)*(byte *)(in_stack_00000028 + (long)local_44 * 2);
        local_48 = (uint)*(byte *)(in_stack_00000028 + 1 + (long)local_44 * 2);
        if (in_stack_00000020 == 0) {
          local_100 = adjust_strength(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
        }
        else {
          local_100 = local_50;
        }
        bVar7 = (byte)local_54;
        bVar1 = (byte)local_58;
        if (in_stack_00000010 == (int *)0x0) {
          local_114 = (local_4c << (bVar1 & 0x1f)) * local_2c + (local_48 << (bVar7 & 0x1f));
        }
        else {
          local_114 = local_44 << (bVar7 + bVar1 & 0x1f);
        }
        iVar8 = local_2c;
        if (in_stack_00000010 != (int *)0x0) {
          iVar8 = 1 << (bVar7 & 0x1f);
        }
        if (local_50 == 0) {
          local_144 = 0;
        }
        else {
          local_144 = *(int *)(in_stack_00000008 + (long)(int)local_4c * 0x40 +
                              (long)(int)local_48 * 4);
        }
        in_stack_fffffffffffffe90 = iVar3;
        (*local_b8[(int)((uint)(iVar2 == 0) | (uint)(local_100 == 0) << 1)])
                  ((void *)(local_28 + (long)local_114 * 2),iVar8,
                   (uint16_t *)
                   (local_38 +
                   (long)(int)((local_4c * 0x90 << (bVar1 & 0x1f)) + (local_48 << (bVar7 & 0x1f))) *
                   2),local_100,iVar2,local_144,iVar3,iVar3,in_stack_00000050,local_94,local_98);
      }
    }
    else {
      local_60 = 8 >> ((byte)local_3c & 0x1f);
      local_64 = 8 >> ((byte)local_40 & 0x1f);
      local_88[0] = cdef_filter_8_0;
      local_88[1] = cdef_filter_8_1;
      local_88[2] = cdef_filter_8_2;
      local_88[3] = cdef_filter_8_3;
      for (local_44 = 0; local_44 < in_stack_00000030; local_44 = local_44 + 1) {
        local_4c = (uint)*(byte *)(in_stack_00000028 + (long)local_44 * 2);
        local_48 = (uint)*(byte *)(in_stack_00000028 + 1 + (long)local_44 * 2);
        if (in_stack_00000020 == 0) {
          local_c4 = adjust_strength(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
        }
        else {
          local_c4 = local_50;
        }
        local_8c = local_c4;
        local_90 = (uint)(iVar2 == 0) | (uint)(local_c4 == 0) << 1;
        if (local_50 == 0) {
          local_fc = 0;
        }
        else {
          local_fc = *(int *)(in_stack_00000008 + (long)(int)local_4c * 0x40 +
                             (long)(int)local_48 * 4);
        }
        in_stack_fffffffffffffe90 = iVar3;
        (*local_88[(int)local_90])
                  ((void *)(local_20 +
                           (int)((local_4c << ((byte)local_58 & 0x1f)) * local_2c +
                                (local_48 << ((byte)local_54 & 0x1f)))),local_2c,
                   (uint16_t *)
                   (local_38 +
                   (long)(int)((local_4c * 0x90 << ((byte)local_58 & 0x1f)) +
                              (local_48 << ((byte)local_54 & 0x1f))) * 2),local_c4,iVar2,local_fc,
                   iVar3,iVar3,in_stack_00000050,local_60,local_64);
      }
    }
  }
  else {
    for (local_44 = 0; local_44 < in_stack_00000030; local_44 = local_44 + 1) {
      local_4c = (uint)*(byte *)(in_stack_00000028 + (long)local_44 * 2);
      local_48 = (uint)*(byte *)(in_stack_00000028 + 1 + (long)local_44 * 2);
      for (local_5c = 0; bVar7 = (byte)local_58, local_5c < 1 << (bVar7 & 0x1f);
          local_5c = local_5c + 1) {
        bVar1 = (byte)local_54;
        memcpy((void *)(local_28 +
                       (long)((local_44 << (bVar1 + bVar7 & 0x1f)) + (local_5c << (bVar1 & 0x1f))) *
                       2),
               (void *)(local_38 +
                       (long)(int)(((local_4c << (bVar7 & 0x1f)) + local_5c) * 0x90 +
                                  (local_48 << (bVar1 & 0x1f))) * 2),(1L << (bVar1 & 0x3f)) << 1);
      }
    }
  }
  return;
}

Assistant:

void av1_cdef_filter_fb(uint8_t *dst8, uint16_t *dst16, int dstride,
                        const uint16_t *in, int xdec, int ydec,
                        int dir[CDEF_NBLOCKS][CDEF_NBLOCKS], int *dirinit,
                        int var[CDEF_NBLOCKS][CDEF_NBLOCKS], int pli,
                        cdef_list *dlist, int cdef_count, int level,
                        int sec_strength, int damping, int coeff_shift) {
  int bi;
  int bx;
  int by;
  const int pri_strength = level << coeff_shift;
  sec_strength <<= coeff_shift;
  damping += coeff_shift - (pli != AOM_PLANE_Y);
  const int bw_log2 = 3 - xdec;
  const int bh_log2 = 3 - ydec;
  if (dirinit && pri_strength == 0 && sec_strength == 0) {
    // If we're here, both primary and secondary strengths are 0, and
    // we still haven't written anything to y[] yet, so we just copy
    // the input to y[]. This is necessary only for av1_cdef_search()
    // and only av1_cdef_search() sets dirinit.
    for (bi = 0; bi < cdef_count; bi++) {
      by = dlist[bi].by;
      bx = dlist[bi].bx;
      // TODO(stemidts/jmvalin): SIMD optimisations
      for (int iy = 0; iy < 1 << bh_log2; iy++) {
        memcpy(&dst16[(bi << (bw_log2 + bh_log2)) + (iy << bw_log2)],
               &in[((by << bh_log2) + iy) * CDEF_BSTRIDE + (bx << bw_log2)],
               ((size_t)1 << bw_log2) * sizeof(*dst16));
      }
    }
    return;
  }

  if (pli == 0) {
    if (!dirinit || !*dirinit) {
      aom_cdef_find_dir(in, dlist, var, cdef_count, coeff_shift, dir);
      if (dirinit) *dirinit = 1;
    }
  }
  if (pli == 1 && xdec != ydec) {
    for (bi = 0; bi < cdef_count; bi++) {
      static const int conv422[8] = { 7, 0, 2, 4, 5, 6, 6, 6 };
      static const int conv440[8] = { 1, 2, 2, 2, 3, 4, 6, 0 };
      by = dlist[bi].by;
      bx = dlist[bi].bx;
      dir[by][bx] = (xdec ? conv422 : conv440)[dir[by][bx]];
    }
  }

  if (dst8) {
    const int block_width = 8 >> xdec;
    const int block_height = 8 >> ydec;
    /*
     * strength_index == 0 : enable_primary = 1, enable_secondary = 1
     * strength_index == 1 : enable_primary = 1, enable_secondary = 0
     * strength_index == 2 : enable_primary = 0, enable_secondary = 1
     * strength_index == 3 : enable_primary = 0, enable_secondary = 0
     */
    const cdef_filter_block_func cdef_filter_fn[4] = {
      cdef_filter_8_0, cdef_filter_8_1, cdef_filter_8_2, cdef_filter_8_3
    };

    for (bi = 0; bi < cdef_count; bi++) {
      by = dlist[bi].by;
      bx = dlist[bi].bx;
      const int t =
          (pli ? pri_strength : adjust_strength(pri_strength, var[by][bx]));
      const int strength_index = (sec_strength == 0) | ((t == 0) << 1);

      cdef_filter_fn[strength_index](
          &dst8[(by << bh_log2) * dstride + (bx << bw_log2)], dstride,
          &in[(by * CDEF_BSTRIDE << bh_log2) + (bx << bw_log2)], t,
          sec_strength, pri_strength ? dir[by][bx] : 0, damping, damping,
          coeff_shift, block_width, block_height);
    }
  } else {
    const int block_width = 8 >> xdec;
    const int block_height = 8 >> ydec;
    /*
     * strength_index == 0 : enable_primary = 1, enable_secondary = 1
     * strength_index == 1 : enable_primary = 1, enable_secondary = 0
     * strength_index == 2 : enable_primary = 0, enable_secondary = 1
     * strength_index == 3 : enable_primary = 0, enable_secondary = 0
     */
    const cdef_filter_block_func cdef_filter_fn[4] = {
      cdef_filter_16_0, cdef_filter_16_1, cdef_filter_16_2, cdef_filter_16_3
    };

    for (bi = 0; bi < cdef_count; bi++) {
      by = dlist[bi].by;
      bx = dlist[bi].bx;
      const int t =
          (pli ? pri_strength : adjust_strength(pri_strength, var[by][bx]));
      const int strength_index = (sec_strength == 0) | ((t == 0) << 1);

      cdef_filter_fn[strength_index](
          &dst16[dirinit ? bi << (bw_log2 + bh_log2)
                         : (by << bh_log2) * dstride + (bx << bw_log2)],
          dirinit ? 1 << bw_log2 : dstride,
          &in[(by * CDEF_BSTRIDE << bh_log2) + (bx << bw_log2)], t,
          sec_strength, pri_strength ? dir[by][bx] : 0, damping, damping,
          coeff_shift, block_width, block_height);
    }
  }
}